

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::PerspectiveCamera::PDF_We(PerspectiveCamera *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined8 uVar1;
  Point2<float> pt;
  Vector3<float> w;
  Tuple3<pbrt::Vector3,_float> v;
  bool bVar2;
  float *in_RCX;
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar3;
  float fVar4;
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  Vector3f VVar13;
  Point3f PVar14;
  Point3<float> PVar15;
  Bounds2f BVar16;
  Float lensArea;
  Bounds2f sampleBounds;
  Tuple3<pbrt::Point3,_float> in_stack_00000058;
  Point3f pRaster;
  Point3f pCamera;
  Point3f pFocus;
  Float cosTheta;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  float local_168;
  float local_148;
  float in_stack_fffffffffffffebc;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed8;
  Float in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar12 [56];
  
  v = *(Tuple3<pbrt::Vector3,_float> *)(in_RSI + 0xc);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0.0);
  auVar10 = ZEXT856(0);
  VVar13.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffedc;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffed8;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffee0;
  VVar13 = CameraBase::RenderFromCamera
                     ((CameraBase *)in_stack_fffffffffffffec0,VVar13,in_stack_fffffffffffffebc);
  auVar5._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  w.super_Tuple3<pbrt::Vector3,_float>.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  fVar3 = Dot<float>((Vector3<float>)v,w);
  if (*(float *)(in_RDI + 0x5a0) < fVar3) {
    auVar10 = ZEXT856(0);
    PVar14 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffedc);
    auVar6._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar10;
    vmovlpd_avx(auVar6._0_16_);
    auVar10 = ZEXT856(0);
    PVar14.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffedc;
    PVar14.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffed8;
    PVar14.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffee0;
    PVar14 = CameraBase::CameraFromRender
                       ((CameraBase *)in_stack_fffffffffffffec0,PVar14,in_stack_fffffffffffffebc);
    auVar7._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar10;
    vmovlpd_avx(auVar7._0_16_);
    auVar10 = ZEXT856(0);
    auVar12 = SUB6056((undefined1  [60])0x0,4);
    PVar15 = Transform::ApplyInverse<float>
                       ((Transform *)sampleBounds.pMax.super_Tuple2<pbrt::Point2,_float>,
                        in_stack_00000058);
    auVar8._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    vmovlpd_avx(auVar8._0_16_);
    BVar16 = Film::SampleBounds((Film *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ));
    auVar11._0_8_ = BVar16.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar11._8_56_ = auVar12;
    auVar9._0_8_ = BVar16.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar9._8_56_ = auVar10;
    vmovlpd_avx(auVar9._0_16_);
    vmovlpd_avx(auVar11._0_16_);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
    pt.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffebc;
    pt.super_Tuple2<pbrt::Point2,_float>.x = local_148;
    bVar2 = Inside<float>(pt,(Bounds2<float> *)&stack0xfffffffffffffec0);
    if (bVar2) {
      if ((*(float *)(in_RDI + 0x580) != 0.0) || (NAN(*(float *)(in_RDI + 0x580)))) {
        local_168 = Sqr<float>(*(float *)(in_RDI + 0x580));
        local_168 = local_168 * 3.1415927;
      }
      else {
        local_168 = 1.0;
      }
      *in_RDX = 1.0 / local_168;
      fVar3 = *(float *)(in_RDI + 0x5a4);
      fVar4 = Pow<3>(fVar3);
      *in_RCX = 1.0 / (fVar3 * fVar4);
    }
    else {
      *in_RCX = 0.0;
      *in_RDX = 0.0;
    }
  }
  else {
    *in_RCX = 0.0;
    *in_RDX = 0.0;
  }
  return;
}

Assistant:

PBRT_CPU_GPU void PerspectiveCamera::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    // Return zero PDF values if ray direction is not front-facing
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return zero probability for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds)) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Compute lens area  and return perspective camera probabilities
    Float lensArea = lensRadius != 0 ? (Pi * Sqr(lensRadius)) : 1;
    *pdfPos = 1 / lensArea;
    *pdfDir = 1 / (A * Pow<3>(cosTheta));
}